

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O2

StatementSyntax * __thiscall
slang::parsing::Parser::parseVoidCallStatement
          (Parser *this,NamedLabelSyntax *label,AttrList attributes)

{
  ExpressionSyntax *expr;
  VoidCastedCallStatementSyntax *pVVar1;
  Token voidKeyword;
  Token apostrophe;
  Token openParen;
  Token closeParen;
  Token semi;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_68;
  
  voidKeyword = ParserBase::consume(&this->super_ParserBase);
  apostrophe = ParserBase::expect(&this->super_ParserBase,Apostrophe);
  openParen = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
  expr = parseExpression(this);
  closeParen = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
  semi = ParserBase::expect(&this->super_ParserBase,Semicolon);
  local_68.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
  local_68.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_68.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_68.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_006a3268;
  local_68.super_SyntaxListBase.childCount = attributes._M_extent._M_extent_value._M_extent_value;
  local_68.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       attributes._M_ptr;
  local_68.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = attributes._M_extent._M_extent_value._M_extent_value;
  pVVar1 = slang::syntax::SyntaxFactory::voidCastedCallStatement
                     (&this->factory,label,&local_68,voidKeyword,apostrophe,openParen,expr,
                      closeParen,semi);
  return &pVVar1->super_StatementSyntax;
}

Assistant:

StatementSyntax& Parser::parseVoidCallStatement(NamedLabelSyntax* label, AttrList attributes) {
    auto keyword = consume();
    auto apostrophe = expect(TokenKind::Apostrophe);
    auto openParen = expect(TokenKind::OpenParenthesis);
    auto& expr = parseExpression();
    auto closeParen = expect(TokenKind::CloseParenthesis);
    auto semi = expect(TokenKind::Semicolon);
    return factory.voidCastedCallStatement(label, attributes, keyword, apostrophe, openParen, expr,
                                           closeParen, semi);
}